

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

bool __thiscall
MotionTrajectory::AddConstantAccel(MotionTrajectory *this,double acc,double vEnd,bool isInfinite)

{
  pointer ppMVar1;
  ConstantAccel *this_00;
  MotionBase *prevMotion;
  double dVar2;
  double dVar3;
  MotionBase *motion;
  
  ppMVar1 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar1 ==
      (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    prevMotion = (MotionBase *)0x0;
  }
  else {
    prevMotion = ppMVar1[-1];
  }
  this_00 = (ConstantAccel *)operator_new(0x50);
  ConstantAccel::ConstantAccel(this_00,acc,vEnd,isInfinite,prevMotion);
  dVar2 = (this_00->super_MotionBase).t0;
  dVar3 = (this_00->super_MotionBase).tf;
  if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
    motion = (MotionBase *)this_00;
    std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::push_back(&this->motionList,&motion);
    dVar2 = motion->t0;
    dVar3 = motion->tf;
  }
  return (bool)(-(dVar2 != dVar3) & 1);
}

Assistant:

bool MotionTrajectory::AddConstantAccel(double acc, double vEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantAccel(acc, vEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}